

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_soundfile_aiff.c
# Opt level: O1

int aiff_updateheader(t_soundfile *sf,size_t nframes)

{
  int iVar1;
  int iVar2;
  int32_t iVar3;
  ssize_t sVar4;
  uint doit;
  long lVar5;
  long lVar6;
  uint uVar7;
  bool bVar8;
  int32_t inttmp;
  uint32_t uinttmp;
  int32_t local_38;
  uint32_t local_34;
  
  if (sf->sf_bigendian == 0) {
    bVar8 = false;
  }
  else {
    bVar8 = sf->sf_bytespersample != 4;
  }
  iVar2 = sys_isbigendian();
  if (bVar8) {
    lVar5 = 0x1a;
    lVar6 = 0xc;
  }
  else {
    lVar5 = 0x2e;
    if (sf->sf_bytespersample == 4) {
      lVar5 = 0x34;
    }
    lVar6 = 0x18;
  }
  iVar1 = sf->sf_bytesperframe;
  doit = (uint)(iVar2 == 0);
  local_34 = swap4((uint32_t)nframes,doit);
  sVar4 = fd_write(sf->sf_fd,lVar6 + 10,&local_34,4);
  uVar7 = 0;
  if (3 < sVar4) {
    iVar1 = iVar1 * (uint32_t)nframes;
    local_38 = swap4s(iVar1 + 8,doit);
    sVar4 = fd_write(sf->sf_fd,lVar5 + lVar6 + 4,&local_38,4);
    if (3 < sVar4) {
      iVar3 = swap4s(iVar1 + (int)lVar5 + (int)lVar6 + 8,doit);
      _local_38 = CONCAT44(local_34,iVar3);
      sVar4 = fd_write(sf->sf_fd,4,&local_38,4);
      uVar7 = (uint)(3 < sVar4);
    }
  }
  return uVar7;
}

Assistant:

static int aiff_updateheader(t_soundfile *sf, size_t nframes)
{
    int isaiffc = aiff_isaiffc(sf), swap = !sys_isbigendian();
    size_t datasize = nframes * sf->sf_bytesperframe,
           headersize = AIFFHEADSIZE, commsize = AIFFCOMMSIZE;
    uint32_t uinttmp;
    int32_t inttmp;

    if (isaiffc)
    {
            /* AIFF-C compression info */
        if (sf->sf_bytespersample == 4)
            commsize += 4 + AIFF_FL32_LEN;
        else
            commsize += 4 + AIFF_NONE_LEN;
        headersize += AIFFVERSIZE;
    }

        /* num frames */
    uinttmp = swap4((uint32_t)nframes, swap);
    if (fd_write(sf->sf_fd, headersize + 10, &uinttmp, 4) < 4)
        return 0;
    headersize += commsize;

        /* data chunk size (+ offset & block) */
    inttmp = swap4s((int32_t)datasize + 8, swap);
    if (fd_write(sf->sf_fd, headersize + 4, &inttmp, 4) < 4)
        return 0;
    headersize += AIFFDATASIZE;

        /* file header chunk size (- chunk header) */
    inttmp = swap4s((int32_t)(headersize + datasize - 8), swap);
    if (fd_write(sf->sf_fd, 4, &inttmp, 4) < 4)
        return 0;

#ifdef DEBUG_SOUNDFILE
    post("FORM %d", headersize + datasize - 8);
    post("  %s", (aiff_isaiffc(sf) ? "AIFC" : "AIFF"));
    post("COMM %d", commsize);
    post("  frames %d", nframes);
    post("SSND %d", datasize + 8);
#endif

    return 1;
}